

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O3

void __thiscall Diligent::SPIRVShaderResources::~SPIRVShaderResources(SPIRVShaderResources *this)

{
  void *pvVar1;
  ushort uVar2;
  Uint32 UVar3;
  Uint32 UVar4;
  Uint32 UVar5;
  
  UVar3 = (Uint32)this->m_StorageBufferOffset;
  if (this->m_StorageBufferOffset == 0) {
    UVar3 = 0;
  }
  else {
    UVar4 = 0;
    do {
      GetResAttribs(this,UVar4,UVar3,0);
      UVar4 = UVar4 + 1;
      UVar3 = (Uint32)this->m_StorageBufferOffset;
    } while (UVar4 < UVar3);
  }
  uVar2 = this->m_StorageImageOffset;
  UVar4 = uVar2 - UVar3;
  if (UVar4 != 0) {
    UVar5 = 0;
    do {
      GetResAttribs(this,UVar5,UVar4,UVar3);
      UVar5 = UVar5 + 1;
      uVar2 = this->m_StorageImageOffset;
      UVar3 = (Uint32)this->m_StorageBufferOffset;
      UVar4 = uVar2 - UVar3;
    } while (UVar5 < UVar4);
  }
  UVar3 = (Uint32)uVar2;
  uVar2 = this->m_SampledImageOffset;
  UVar4 = uVar2 - UVar3;
  if (UVar4 != 0) {
    UVar5 = 0;
    do {
      GetResAttribs(this,UVar5,UVar4,UVar3);
      UVar5 = UVar5 + 1;
      uVar2 = this->m_SampledImageOffset;
      UVar3 = (Uint32)this->m_StorageImageOffset;
      UVar4 = uVar2 - UVar3;
    } while (UVar5 < UVar4);
  }
  UVar3 = (Uint32)uVar2;
  uVar2 = this->m_AtomicCounterOffset;
  UVar4 = uVar2 - UVar3;
  if (UVar4 != 0) {
    UVar5 = 0;
    do {
      GetResAttribs(this,UVar5,UVar4,UVar3);
      UVar5 = UVar5 + 1;
      uVar2 = this->m_AtomicCounterOffset;
      UVar3 = (Uint32)this->m_SampledImageOffset;
      UVar4 = uVar2 - UVar3;
    } while (UVar5 < UVar4);
  }
  UVar3 = (Uint32)uVar2;
  uVar2 = this->m_SeparateSamplerOffset;
  UVar4 = uVar2 - UVar3;
  if (UVar4 != 0) {
    UVar5 = 0;
    do {
      GetResAttribs(this,UVar5,UVar4,UVar3);
      UVar5 = UVar5 + 1;
      uVar2 = this->m_SeparateSamplerOffset;
      UVar3 = (Uint32)this->m_AtomicCounterOffset;
      UVar4 = uVar2 - UVar3;
    } while (UVar5 < UVar4);
  }
  UVar3 = (Uint32)uVar2;
  uVar2 = this->m_SeparateImageOffset;
  UVar4 = uVar2 - UVar3;
  if (UVar4 != 0) {
    UVar5 = 0;
    do {
      GetResAttribs(this,UVar5,UVar4,UVar3);
      UVar5 = UVar5 + 1;
      uVar2 = this->m_SeparateImageOffset;
      UVar3 = (Uint32)this->m_SeparateSamplerOffset;
      UVar4 = uVar2 - UVar3;
    } while (UVar5 < UVar4);
  }
  UVar3 = (Uint32)uVar2;
  uVar2 = this->m_InputAttachmentOffset;
  UVar4 = uVar2 - UVar3;
  if (UVar4 != 0) {
    UVar5 = 0;
    do {
      GetResAttribs(this,UVar5,UVar4,UVar3);
      UVar5 = UVar5 + 1;
      uVar2 = this->m_InputAttachmentOffset;
      UVar3 = (Uint32)this->m_SeparateImageOffset;
      UVar4 = uVar2 - UVar3;
    } while (UVar5 < UVar4);
  }
  UVar3 = (Uint32)uVar2;
  uVar2 = this->m_AccelStructOffset;
  UVar4 = uVar2 - UVar3;
  if (UVar4 != 0) {
    UVar5 = 0;
    do {
      GetResAttribs(this,UVar5,UVar4,UVar3);
      UVar5 = UVar5 + 1;
      uVar2 = this->m_AccelStructOffset;
      UVar3 = (Uint32)this->m_InputAttachmentOffset;
      UVar4 = uVar2 - UVar3;
    } while (UVar5 < UVar4);
  }
  if (this->m_NumShaderStageInputs != 0) {
    UVar3 = 0;
    do {
      GetShaderStageInputAttribs(this,UVar3);
      UVar3 = UVar3 + 1;
    } while (UVar3 < this->m_NumShaderStageInputs);
    uVar2 = this->m_AccelStructOffset;
  }
  UVar3 = (Uint32)uVar2;
  UVar4 = (uint)this->m_TotalResources - (uint)uVar2;
  if (UVar4 != 0) {
    UVar5 = 0;
    do {
      GetResAttribs(this,UVar5,UVar4,UVar3);
      UVar5 = UVar5 + 1;
      UVar3 = (Uint32)this->m_AccelStructOffset;
      UVar4 = this->m_TotalResources - UVar3;
    } while (UVar5 < UVar4);
  }
  pvVar1 = (this->m_UBReflectionBuffer)._M_t.
           super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t
           .super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
           super__Head_base<0UL,_void_*,_false>._M_head_impl;
  if (pvVar1 != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&this->m_UBReflectionBuffer,pvVar1);
  }
  (this->m_UBReflectionBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  pvVar1 = (this->m_MemoryBuffer)._M_t.
           super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t
           .super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
           super__Head_base<0UL,_void_*,_false>._M_head_impl;
  if (pvVar1 != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)this,pvVar1);
  }
  (this->m_MemoryBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  return;
}

Assistant:

SPIRVShaderResources::~SPIRVShaderResources()
{
    for (Uint32 n = 0; n < GetNumUBs(); ++n)
        GetUB(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSBs(); ++n)
        GetSB(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumImgs(); ++n)
        GetImg(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSmpldImgs(); ++n)
        GetSmpldImg(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumACs(); ++n)
        GetAC(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSepSmplrs(); ++n)
        GetSepSmplr(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSepImgs(); ++n)
        GetSepImg(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumInptAtts(); ++n)
        GetInptAtt(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumShaderStageInputs(); ++n)
        GetShaderStageInputAttribs(n).~SPIRVShaderStageInputAttribs();

    for (Uint32 n = 0; n < GetNumAccelStructs(); ++n)
        GetAccelStruct(n).~SPIRVShaderResourceAttribs();

    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please add destructor for the new resource");
}